

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set_timings.c
# Opt level: O0

int launch(nvamemtiming_conf *conf,FILE *outf,uint8_t progression,color color)

{
  int iVar1;
  __pid_t _Var2;
  byte in_DL;
  uint8_t *in_RSI;
  long in_RDI;
  uint8_t unaff_retaddr;
  pid_t pid;
  int in_stack_00000084;
  color in_stack_000000b0;
  int8_t in_stack_000000b7;
  FILE *in_stack_000000b8;
  nvamemtiming_conf *in_stack_000000c0;
  undefined3 in_stack_ffffffffffffffe4;
  int length;
  int in_stack_fffffffffffffffc;
  
  length = CONCAT13(in_DL,in_stack_ffffffffffffffe4);
  printf("--- Start sequence number %u\n",(ulong)in_DL);
  iVar1 = system("rmmod nvidia");
  if (iVar1 == 0x7f) {
    fprintf(_stderr,"rmmod not found. Abort\n");
    exit(2);
  }
  iVar1 = vbios_upload_pramin((int)in_RDI,in_RSI,length);
  if (iVar1 == 1) {
    setenv("DISPLAY",":0",1);
    if (*(int *)(in_RDI + 4) != 0) {
      mmiotrace_start(in_stack_00000084);
    }
    _Var2 = fork();
    if (_Var2 != 0) {
      if (_Var2 != -1) {
        iVar1 = force_timing_changes(unaff_retaddr,in_stack_fffffffffffffffc);
        if (iVar1 == 0) {
          if (*(int *)(in_RDI + 4) != 0) {
            mmiotrace_stop();
          }
          dump_timings(in_stack_000000c0,in_stack_000000b8,in_stack_000000b7,in_stack_000000b0);
          system("killall X");
          do {
            _Var2 = wait((void *)0x0);
          } while (0 < _Var2);
          *(short *)(in_RDI + 8) = *(short *)(in_RDI + 8) + 1;
          sleep(5);
          iVar1 = 0;
        }
        else {
          iVar1 = 1;
        }
        return iVar1;
      }
      fprintf(_stderr,"Fork failed! Abort\n");
      exit(4);
    }
    system("killall X 2> /dev/null > /dev/null");
    system("X > /dev/null 2> /dev/null");
    fprintf(_stderr,"X exited, let\'s quit!\n");
    exit(0);
  }
  fprintf(_stderr,"upload failed. Abort\n");
  exit(3);
}

Assistant:

static int
launch(struct nvamemtiming_conf *conf, FILE *outf, uint8_t progression, enum color color)
{
	printf("--- Start sequence number %u\n", progression);

	if (system("rmmod nvidia") == 127)
	{
		fprintf(stderr, "rmmod not found. Abort\n");
		exit (2);
	}

	if (vbios_upload_pramin(conf->cnum, conf->vbios.data, conf->vbios.length) != 1)
	{
		fprintf(stderr, "upload failed. Abort\n");
		exit(3);
	}

	/* modify our env so as we can launch apps on X */
	setenv("DISPLAY", ":0", 1);

	/* monitor downclocking */
	if (conf->mmiotrace)
		mmiotrace_start(progression);

	pid_t pid = fork();
	if (pid == 0) {
		system("killall X 2> /dev/null > /dev/null");
		system("X > /dev/null 2> /dev/null");
		fprintf(stderr, "X exited, let's quit!\n");
		exit(0);
	} else if (pid == -1) {
		fprintf(stderr, "Fork failed! Abort\n");
		exit (4);
	}

	/* X runs, wait for the right perflvl to be selected */
	if (force_timing_changes(conf->timing.perflvl, conf->mmiotrace))
		return 1;

	if (conf->mmiotrace)
                mmiotrace_stop();

	dump_timings(conf, outf, progression, color);

	system("killall X");

	/* wait for all zombie processes */
	while(wait(NULL) > 0);

	/* increase the launch counter */
	conf->counter++;

	/* wait for the nvidia driver to modeset back to the crappy resolution */
	sleep(5);

	return 0;
}